

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minSelect(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *val,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *stab,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *bestDelta,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *max,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *update,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *lowBound,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *upBound,int start,int incr)

{
  uint *puVar1;
  uint uVar2;
  int *piVar3;
  pointer pnVar4;
  undefined8 uVar5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  SPxId *pSVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  DataKey DVar11;
  DataKey DVar12;
  undefined1 auVar13 [16];
  int iVar14;
  fpclass_type fVar15;
  fpclass_type fVar16;
  ulong uVar17;
  DataKey DVar18;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar19;
  cpp_dec_float<50U,_int,_void> *pcVar20;
  cpp_dec_float<50U,_int,_void> *v;
  DataKey *pDVar21;
  uint *puVar22;
  undefined1 local_188 [16];
  DataKey local_178;
  uint uStack_170;
  undefined3 uStack_16b;
  DataKey local_168;
  int local_160;
  bool local_15c;
  DataKey local_158;
  uint local_150;
  uint local_14c;
  DataKey local_148;
  DataKey DStack_140;
  DataKey local_138;
  uint uStack_130;
  undefined3 uStack_12b;
  DataKey local_128;
  int local_120;
  bool local_11c;
  undefined8 local_118;
  undefined4 local_10c;
  pointer local_108;
  cpp_dec_float<50U,_int,_void> *local_100;
  undefined1 local_f8 [16];
  uint local_e8 [3];
  undefined3 uStack_db;
  uint local_d8 [3];
  bool local_cc;
  undefined8 local_c8;
  Type local_bc;
  cpp_dec_float<50U,_int,_void> local_b8;
  DataKey *local_78;
  pointer local_70;
  DataKey *local_68;
  cpp_dec_float<50U,_int,_void> *local_60;
  pointer local_58;
  cpp_dec_float<50U,_int,_void> *local_50;
  uint *local_48;
  long local_40;
  uint *local_38;
  
  local_118 = 0xa00000000;
  local_148.info = 0;
  local_148.idx = 0;
  DStack_140.info = 0;
  DStack_140.idx = 0;
  local_138.info = 0;
  local_138.idx = 0;
  _uStack_130 = 0;
  uStack_12b = 0;
  local_128.info = 0;
  local_128.idx = 0;
  local_120 = 0;
  local_11c = false;
  local_bc = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_type;
  if (local_bc == LEAVE) {
    local_10c = 0;
  }
  else {
    pSVar6 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_10c = (undefined4)CONCAT71((int7)((ulong)pSVar6 >> 8),pSVar6->theRep == ROW);
  }
  iVar14 = (update->thedelta).super_IdxSet.num;
  if (iVar14 <= start) {
    return 0xffffffff;
  }
  local_70 = (upBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (lowBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_108 = (update->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  piVar3 = (update->thedelta).super_IdxSet.idx;
  pnVar4 = (update->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (uint *)(piVar3 + iVar14);
  puVar22 = (uint *)(piVar3 + start);
  local_48 = (stab->m_backend).data._M_elems + 1;
  local_40 = (long)incr << 2;
  local_150 = 0xffffffff;
  local_14c = 0xffffffff;
  local_100 = &max->m_backend;
  local_78 = (DataKey *)bestDelta;
  local_68 = (DataKey *)val;
  local_60 = &best->m_backend;
  local_50 = &stab->m_backend;
  do {
    uVar2 = *puVar22;
    uVar5 = *(undefined8 *)((long)&pnVar4[(int)uVar2].m_backend.data + 0x20);
    local_b8.data._M_elems[8] = (uint)uVar5;
    local_b8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
    uVar5 = *(undefined8 *)&pnVar4[(int)uVar2].m_backend.data;
    uVar8 = *(undefined8 *)((long)&pnVar4[(int)uVar2].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar4[(int)uVar2].m_backend.data + 0x10);
    uVar9 = *(undefined8 *)puVar1;
    uVar10 = *(undefined8 *)(puVar1 + 2);
    local_b8.data._M_elems[4] = (uint)uVar9;
    local_b8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
    local_b8.data._M_elems[6] = (uint)uVar10;
    local_b8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
    local_b8.data._M_elems[0] = (uint)uVar5;
    local_b8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
    local_b8.data._M_elems[2] = (uint)uVar8;
    local_b8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
    local_b8.exp = pnVar4[(int)uVar2].m_backend.exp;
    local_b8.neg = pnVar4[(int)uVar2].m_backend.neg;
    local_b8.fpclass = pnVar4[(int)uVar2].m_backend.fpclass;
    local_b8.prec_elem = pnVar4[(int)uVar2].m_backend.prec_elem;
    if (local_bc == LEAVE) {
      pSVar6 = (this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      if (this->iscoid == true) {
        pDVar19 = (pSVar6->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.costat;
      }
      else {
        pDVar19 = (pSVar6->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.stat;
      }
      if (pSVar6->theRep * pDVar19->data[(int)uVar2] < 1) goto LAB_002db87b;
    }
    else {
LAB_002db87b:
      if ((char)local_10c == '\0') {
LAB_002db8e1:
        fVar15 = local_b8.fpclass;
      }
      else {
        pSVar6 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        pSVar7 = (pSVar6->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).theBaseId.data;
        if (pSVar7[(int)uVar2].super_DataKey.info < 1) goto LAB_002db8e1;
        SPxColId::SPxColId((SPxColId *)local_188,pSVar7 + (int)uVar2);
        iVar14 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                 ::number(&(pSVar6->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set,(DataKey *)local_188);
        stab = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_50;
        if ((pSVar6->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedesc.colstat.data[iVar14] == P_FIXED) goto LAB_002dbe5b;
        fVar15 = local_b8.fpclass;
      }
      fVar16 = (stab->m_backend).fpclass;
      if (fVar16 == cpp_dec_float_NaN || fVar15 == cpp_dec_float_NaN) {
LAB_002db9cb:
        local_168 = *(DataKey *)((stab->m_backend).data._M_elems + 8);
        auVar13 = *(undefined1 (*) [16])(stab->m_backend).data._M_elems;
        local_178 = *(DataKey *)((stab->m_backend).data._M_elems + 4);
        uVar5 = *(undefined8 *)((stab->m_backend).data._M_elems + 6);
        _uStack_170 = (undefined5)uVar5;
        uStack_16b = (undefined3)((ulong)uVar5 >> 0x28);
        local_160 = (stab->m_backend).exp;
        local_15c = (stab->m_backend).neg;
        local_158.idx = (stab->m_backend).prec_elem;
        local_158.info = fVar16;
        local_188._0_4_ = (undefined4)*(undefined8 *)(stab->m_backend).data._M_elems;
        if (local_188._0_4_ != 0 || fVar16 != cpp_dec_float_finite) {
          local_15c = (bool)(local_15c ^ 1);
        }
        local_188 = auVar13;
        if (((fVar16 == cpp_dec_float_NaN) || (local_b8.fpclass == cpp_dec_float_NaN)) ||
           (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_b8,(cpp_dec_float<50U,_int,_void> *)local_188), -1 < iVar14))
        goto LAB_002dbe5b;
        pcVar20 = &local_70[(int)uVar2].m_backend;
        local_c8._0_4_ = cpp_dec_float_finite;
        local_c8._4_4_ = 10;
        local_f8 = (undefined1  [16])0x0;
        local_e8[0] = 0;
        local_e8[1] = 0;
        stack0xffffffffffffff20 = 0;
        uStack_db = 0;
        local_d8[0] = 0;
        local_d8[1] = 0;
        local_d8[2] = 0;
        local_cc = false;
        if ((cpp_dec_float<50U,_int,_void> *)local_f8 == &local_108[(int)uVar2].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)local_f8,pcVar20);
          if (local_f8._0_4_ != 0 || (fpclass_type)local_c8 != cpp_dec_float_finite) {
            local_cc = (bool)(local_cc ^ 1);
          }
        }
        else {
          if ((cpp_dec_float<50U,_int,_void> *)local_f8 != pcVar20) {
            local_d8._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
            local_f8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
            local_e8._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
            uVar5 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
            stack0xffffffffffffff20 = (undefined5)uVar5;
            uStack_db = (undefined3)((ulong)uVar5 >> 0x28);
            local_d8[2] = pcVar20->exp;
            local_cc = pcVar20->neg;
            local_c8._0_4_ = pcVar20->fpclass;
            local_c8._4_4_ = pcVar20->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)local_f8,&local_108[(int)uVar2].m_backend);
        }
        local_158.info = 0;
        local_158.idx = 10;
        local_188 = (undefined1  [16])0x0;
        local_178.info = 0;
        local_178.idx = 0;
        _uStack_170 = 0;
        uStack_16b = 0;
        local_168.info = 0;
        local_168.idx = 0;
        local_160 = 0;
        local_15c = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_188,
                   (cpp_dec_float<50U,_int,_void> *)local_f8,&local_b8);
        auVar13 = local_188;
        local_128 = local_168;
        local_138 = local_178;
        _uStack_130 = _uStack_170;
        uStack_12b = uStack_16b;
        local_148.info = local_188._0_4_;
        local_148.idx = local_188._4_4_;
        DStack_140.info = local_188._8_4_;
        DStack_140.idx = local_188._12_4_;
        local_120 = local_160;
        local_11c = local_15c;
        local_118._0_4_ = local_158.info;
        local_118._4_4_ = local_158.idx;
        DVar18 = local_158;
        local_188 = auVar13;
        DVar11 = local_158;
        DVar12 = local_148;
        if ((local_158.info != 2) &&
           (DVar11 = (DataKey)local_118, local_100->fpclass != cpp_dec_float_NaN)) {
          iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)&local_148,local_100);
          DVar18 = (DataKey)(local_118 & 0xffffffff);
          DVar11 = (DataKey)local_118;
          DVar12 = local_148;
          if (-1 < iVar14) {
            local_68[4] = local_128;
            DVar12.idx._1_3_ = uStack_12b;
            DVar12._0_5_ = _uStack_130;
            local_68[2] = local_138;
            local_68[3] = DVar12;
            *local_68 = local_148;
            local_68[1] = DStack_140;
            local_68[5].info = local_120;
            *(bool *)&local_68[5].idx = local_11c;
            local_68[6].info = (fpclass_type)local_118;
            local_68[6].idx = local_118._4_4_;
            (stab->m_backend).data._M_elems[0] = local_b8.data._M_elems[0];
            local_48[8] = local_b8.data._M_elems[9];
            *(ulong *)(local_48 + 4) = CONCAT44(local_b8.data._M_elems[6],local_b8.data._M_elems[5])
            ;
            *(ulong *)(local_48 + 6) = CONCAT44(local_b8.data._M_elems[8],local_b8.data._M_elems[7])
            ;
            *(ulong *)local_48 = CONCAT44(local_b8.data._M_elems[2],local_b8.data._M_elems[1]);
            *(ulong *)(local_48 + 2) = CONCAT44(local_b8.data._M_elems[4],local_b8.data._M_elems[3])
            ;
            (stab->m_backend).exp = local_b8.exp;
            (stab->m_backend).neg =
                 (bool)((local_b8.data._M_elems[0] != 0 || local_b8.fpclass != cpp_dec_float_finite)
                       ^ local_b8.neg);
            (stab->m_backend).fpclass = local_b8.fpclass;
            (stab->m_backend).prec_elem = local_b8.prec_elem;
            local_14c = uVar2;
            goto LAB_002dbe5b;
          }
        }
      }
      else {
        iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_b8,&stab->m_backend);
        if (iVar14 < 1) {
          fVar16 = (stab->m_backend).fpclass;
          goto LAB_002db9cb;
        }
        pcVar20 = &local_58[(int)uVar2].m_backend;
        local_c8._0_4_ = cpp_dec_float_finite;
        local_c8._4_4_ = 10;
        local_f8 = (undefined1  [16])0x0;
        local_e8[0] = 0;
        local_e8[1] = 0;
        stack0xffffffffffffff20 = 0;
        uStack_db = 0;
        local_d8[0] = 0;
        local_d8[1] = 0;
        local_d8[2] = 0;
        local_cc = false;
        if ((cpp_dec_float<50U,_int,_void> *)local_f8 == &local_108[(int)uVar2].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)local_f8,pcVar20);
          if (local_f8._0_4_ != 0 || (fpclass_type)local_c8 != cpp_dec_float_finite) {
            local_cc = (bool)(local_cc ^ 1);
          }
        }
        else {
          if ((cpp_dec_float<50U,_int,_void> *)local_f8 != pcVar20) {
            local_d8._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
            local_f8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
            local_e8._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
            uVar5 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
            stack0xffffffffffffff20 = (undefined5)uVar5;
            uStack_db = (undefined3)((ulong)uVar5 >> 0x28);
            local_d8[2] = pcVar20->exp;
            local_cc = pcVar20->neg;
            local_c8._0_4_ = pcVar20->fpclass;
            local_c8._4_4_ = pcVar20->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)local_f8,&local_108[(int)uVar2].m_backend);
        }
        local_158.info = 0;
        local_158.idx = 10;
        local_188 = (undefined1  [16])0x0;
        local_178.info = 0;
        local_178.idx = 0;
        _uStack_170 = 0;
        uStack_16b = 0;
        local_168.info = 0;
        local_168.idx = 0;
        local_160 = 0;
        local_15c = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_188,
                   (cpp_dec_float<50U,_int,_void> *)local_f8,&local_b8);
        auVar13 = local_188;
        local_128 = local_168;
        local_138 = local_178;
        _uStack_130 = _uStack_170;
        uStack_12b = uStack_16b;
        local_148.info = local_188._0_4_;
        local_148.idx = local_188._4_4_;
        DVar12 = local_148;
        local_148.info = local_188._0_4_;
        local_148.idx = local_188._4_4_;
        DStack_140.info = local_188._8_4_;
        DStack_140.idx = local_188._12_4_;
        local_120 = local_160;
        local_11c = local_15c;
        local_118._0_4_ = local_158.info;
        local_118._4_4_ = local_158.idx;
        DVar18 = local_158;
        local_188 = auVar13;
        DVar11 = local_158;
        if ((local_158.info != 2) &&
           (DVar11 = (DataKey)local_118, local_100->fpclass != cpp_dec_float_NaN)) {
          iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)&local_148,local_100);
          DVar18 = (DataKey)(local_118 & 0xffffffff);
          DVar11 = (DataKey)local_118;
          DVar12 = local_148;
          if (-1 < iVar14) {
            local_68[4] = local_128;
            DVar18.idx._1_3_ = uStack_12b;
            DVar18._0_5_ = _uStack_130;
            local_68[2] = local_138;
            local_68[3] = DVar18;
            *local_68 = local_148;
            local_68[1] = DStack_140;
            local_68[5].info = local_120;
            *(bool *)&local_68[5].idx = local_11c;
            local_68[6].info = (fpclass_type)local_118;
            local_68[6].idx = local_118._4_4_;
            *(ulong *)((stab->m_backend).data._M_elems + 8) =
                 CONCAT44(local_b8.data._M_elems[9],local_b8.data._M_elems[8]);
            *(ulong *)((stab->m_backend).data._M_elems + 4) =
                 CONCAT44(local_b8.data._M_elems[5],local_b8.data._M_elems[4]);
            *(ulong *)((stab->m_backend).data._M_elems + 6) =
                 CONCAT44(local_b8.data._M_elems[7],local_b8.data._M_elems[6]);
            *(ulong *)(stab->m_backend).data._M_elems =
                 CONCAT44(local_b8.data._M_elems[1],local_b8.data._M_elems[0]);
            *(ulong *)((stab->m_backend).data._M_elems + 2) =
                 CONCAT44(local_b8.data._M_elems[3],local_b8.data._M_elems[2]);
            (stab->m_backend).exp = local_b8.exp;
            (stab->m_backend).neg = local_b8.neg;
            (stab->m_backend).fpclass = local_b8.fpclass;
            (stab->m_backend).prec_elem = local_b8.prec_elem;
            local_14c = uVar2;
            goto LAB_002dbe5b;
          }
        }
      }
      local_148 = DVar12;
      local_118 = (ulong)DVar11;
      pcVar20 = local_60;
      if (((SUB84(DVar18,0) != 2) && (local_60->fpclass != cpp_dec_float_NaN)) &&
         (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)&local_148,local_60), iVar14 < 0)) {
        *(DataKey *)((pcVar20->data)._M_elems + 8) = local_128;
        *(DataKey *)((pcVar20->data)._M_elems + 4) = local_138;
        *(ulong *)((pcVar20->data)._M_elems + 6) = CONCAT35(uStack_12b,_uStack_130);
        (pcVar20->data)._M_elems[0] = local_148.info;
        (pcVar20->data)._M_elems[1] = local_148.idx;
        *(DataKey *)((pcVar20->data)._M_elems + 2) = DStack_140;
        pcVar20->exp = local_120;
        pcVar20->neg = local_11c;
        pcVar20->fpclass = (fpclass_type)local_118;
        pcVar20->prec_elem = local_118._4_4_;
        local_150 = uVar2;
      }
    }
LAB_002dbe5b:
    uVar2 = local_14c;
    puVar22 = (uint *)((long)puVar22 + local_40);
  } while (puVar22 < local_38);
  if ((int)local_150 < 1 || -1 < (int)local_14c) {
    return local_14c;
  }
  uVar17 = (ulong)local_150;
  if (pnVar4[uVar17].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_002dbec5:
    pcVar20 = &local_108[uVar17].m_backend;
    v = &local_58[uVar17].m_backend;
    local_158.info = 0;
    local_158.idx = 10;
    local_188 = (undefined1  [16])0x0;
    local_178.info = 0;
    local_178.idx = 0;
    _uStack_170 = 0;
    uStack_16b = 0;
    local_168.info = 0;
    local_168.idx = 0;
    local_160 = 0;
    local_15c = false;
    if ((cpp_dec_float<50U,_int,_void> *)local_188 == v) {
LAB_002dbf55:
      pDVar21 = local_78;
      local_15c = false;
      local_160 = 0;
      local_168.info = 0;
      local_168.idx = 0;
      uStack_16b = 0;
      _uStack_170 = 0;
      local_178.info = 0;
      local_178.idx = 0;
      local_158.info = 0;
      local_158.idx = 10;
      local_188 = (undefined1  [16])0x0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)local_188,pcVar20);
      if (local_188._0_4_ != 0 || local_158.info != cpp_dec_float_finite) {
        local_15c = (bool)(local_15c ^ 1);
      }
      goto LAB_002dbf75;
    }
    if ((cpp_dec_float<50U,_int,_void> *)local_188 != pcVar20) {
      local_168 = *(DataKey *)((pcVar20->data)._M_elems + 8);
      local_188 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
      local_178 = *(DataKey *)((pcVar20->data)._M_elems + 4);
      uVar5 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
      _uStack_170 = (undefined5)uVar5;
      uStack_16b = (undefined3)((ulong)uVar5 >> 0x28);
      local_160 = pcVar20->exp;
      local_15c = pcVar20->neg;
      local_158.info = pcVar20->fpclass;
      local_158.idx = pcVar20->prec_elem;
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<50U,_int,_void> *)local_188,0,(type *)0x0);
    iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&pnVar4[uVar17].m_backend,(cpp_dec_float<50U,_int,_void> *)local_188);
    if (-1 < iVar14) goto LAB_002dbec5;
    pcVar20 = &local_70[uVar17].m_backend;
    v = &local_108[uVar17].m_backend;
    local_158.info = 0;
    local_158.idx = 10;
    local_188 = (undefined1  [16])0x0;
    local_178.info = 0;
    local_178.idx = 0;
    _uStack_170 = 0;
    uStack_16b = 0;
    local_168.info = 0;
    local_168.idx = 0;
    local_160 = 0;
    local_15c = false;
    if ((cpp_dec_float<50U,_int,_void> *)local_188 == v) goto LAB_002dbf55;
    if ((cpp_dec_float<50U,_int,_void> *)local_188 != pcVar20) {
      local_168 = *(DataKey *)((pcVar20->data)._M_elems + 8);
      local_188 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
      local_178 = *(DataKey *)((pcVar20->data)._M_elems + 4);
      uVar5 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
      _uStack_170 = (undefined5)uVar5;
      uStack_16b = (undefined3)((ulong)uVar5 >> 0x28);
      local_160 = pcVar20->exp;
      local_15c = pcVar20->neg;
      local_158.info = pcVar20->fpclass;
      local_158.idx = pcVar20->prec_elem;
    }
  }
  pDVar21 = local_78;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            ((cpp_dec_float<50U,_int,_void> *)local_188,v);
LAB_002dbf75:
  pDVar21[4] = local_168;
  DVar11.idx._1_3_ = uStack_16b;
  DVar11._0_5_ = _uStack_170;
  pDVar21[2] = local_178;
  pDVar21[3] = DVar11;
  pDVar21->info = local_188._0_4_;
  pDVar21->idx = local_188._4_4_;
  pDVar21[1].info = local_188._8_4_;
  pDVar21[1].idx = local_188._12_4_;
  pDVar21[5].info = local_160;
  *(bool *)&pDVar21[5].idx = local_15c;
  pDVar21[6] = local_158;
  return uVar2;
}

Assistant:

int SPxFastRT<R>::minSelect(
   R& val,
   R& stab,
   R& best,
   R& bestDelta,
   R max,
   const UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i;
   R x, y;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();
   const int* last = idx + update.delta().size();

   int nr = -1;
   int bestNr = -1;

   for(idx += start; idx < last; idx += incr)
   {
      i = *idx;
      x = upd[i];

      // in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables
      if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                     && this->thesolver->isBasic(i))))
         continue;

      if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
            && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
            == SPxBasisBase<R>::Desc::P_FIXED)
         continue;

      if(x > stab)
      {
         y = (low[i] - vec[i]) / x;

         if(y >= max)
         {
            val = y;
            nr = i;
            stab = x;
         }
         else if(y < best)
         {
            best = y;
            bestNr = i;
         }
      }
      else if(x < -stab)
      {
         y = (up[i] - vec[i]) / x;

         if(y >= max)
         {
            val = y;
            nr = i;
            stab = -x;
         }
         else if(y < best)
         {
            best = y;
            bestNr = i;
         }
      }
   }

   if(nr < 0 && bestNr > 0)
   {
      if(upd[bestNr] < 0)
         bestDelta = up[bestNr] - vec[bestNr];
      else
         bestDelta = vec[bestNr] - low[bestNr];
   }

   return nr;
}